

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O1

Aig_Man_t * Aig_ManChoiceConstructive(Vec_Ptr_t *vAigs,int fVerbose)

{
  Aig_Man_t *pThis;
  Aig_Man_t *pAVar1;
  Aig_Obj_t **__s;
  Aig_Man_t *pAVar2;
  Vec_Ptr_t *vPios;
  Tim_Man_t *pTVar3;
  long lVar4;
  size_t __size;
  
  if (0 < vAigs->nSize) {
    pAVar2 = (Aig_Man_t *)*vAigs->pArray;
    pAVar1 = Aig_ManDupOrdered(pAVar2);
    if (pAVar1->pReprs != (Aig_Obj_t **)0x0) {
      __assert_fail("pNew->pReprs == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                    ,0x625,"Aig_Man_t *Aig_ManChoiceConstructive(Vec_Ptr_t *, int)");
    }
    lVar4 = (long)pAVar1->vObjs->nSize * (long)vAigs->nSize;
    pAVar1->nReprsAlloc = (int)lVar4;
    __size = lVar4 * 8;
    __s = (Aig_Obj_t **)malloc(__size);
    pAVar1->pReprs = __s;
    memset(__s,0,__size);
    if (1 < vAigs->nSize) {
      lVar4 = 1;
      do {
        pThis = (Aig_Man_t *)vAigs->pArray[lVar4];
        Aig_ManChoiceConstructiveOne(pAVar1,pAVar2,pThis);
        lVar4 = lVar4 + 1;
        pAVar2 = pThis;
      } while (lVar4 < vAigs->nSize);
    }
    pAVar2 = Aig_ManRehash(pAVar1);
    Aig_ManMarkValidChoices(pAVar2);
    if (0 < vAigs->nSize) {
      vPios = Aig_ManOrderPios(pAVar2,(Aig_Man_t *)*vAigs->pArray);
      pAVar1 = Aig_ManDupDfsGuided(pAVar2,vPios);
      Aig_ManStop(pAVar2);
      if (vPios->pArray != (void **)0x0) {
        free(vPios->pArray);
        vPios->pArray = (void **)0x0;
      }
      if (vPios != (Vec_Ptr_t *)0x0) {
        free(vPios);
      }
      if (0 < vAigs->nSize) {
        pTVar3 = *(Tim_Man_t **)((long)*vAigs->pArray + 0x160);
        if (pTVar3 != (Tim_Man_t *)0x0) {
          pTVar3 = Tim_ManDup(pTVar3,0);
          pAVar1->pManTime = pTVar3;
        }
        Aig_ManChoiceLevel(pAVar1);
        return pAVar1;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t * Aig_ManChoiceConstructive( Vec_Ptr_t * vAigs, int fVerbose )
{
    Vec_Ptr_t * vPios;
    Aig_Man_t * pNew, * pThis, * pPrev, * pTemp;
    int i;
    // start AIG with choices
    pPrev = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    pNew = Aig_ManDupOrdered( pPrev );
    // create room for equivalent nodes and representatives
    assert( pNew->pReprs == NULL );
    pNew->nReprsAlloc = Vec_PtrSize(vAigs) * Aig_ManObjNumMax(pNew);
    pNew->pReprs = ABC_ALLOC( Aig_Obj_t *, pNew->nReprsAlloc );
    memset( pNew->pReprs, 0, sizeof(Aig_Obj_t *) * pNew->nReprsAlloc );
    // add other AIGs one by one
    Vec_PtrForEachEntryStart( Aig_Man_t *, vAigs, pThis, i, 1 )
    {
        Aig_ManChoiceConstructiveOne( pNew, pPrev, pThis );
        pPrev = pThis;
    }
    // derive the result of choicing
    pNew = Aig_ManRehash( pNew );
    // create the equivalent nodes lists
    Aig_ManMarkValidChoices( pNew );
    // reconstruct the network
    vPios = Aig_ManOrderPios( pNew, (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 ) );
    pNew = Aig_ManDupDfsGuided( pTemp = pNew, vPios );
    Aig_ManStop( pTemp );
    Vec_PtrFree( vPios );
    // duplicate the timing manager
    pTemp = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    if ( pTemp->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)pTemp->pManTime, 0 );
    // reset levels
    Aig_ManChoiceLevel( pNew );
    return pNew;
}